

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O0

csp_packet_t *
csp_can_pbuf_find(csp_can_interface_data_t *ifdata,uint32_t id,uint32_t mask,int *task_woken)

{
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  csp_packet_t *packet;
  uint32_t local_2c;
  csp_packet_t *local_28;
  
  local_28 = *(csp_packet_t **)(in_RDI + 0x10);
  while( true ) {
    if (local_28 == (csp_packet_t *)0x0) {
      return (csp_packet_t *)0x0;
    }
    if (((local_28->field_0).field_0.timestamp_rx & in_EDX) == (in_ESI & in_EDX)) break;
    local_28 = local_28->next;
  }
  if (in_RCX == 0) {
    local_2c = csp_get_ms();
  }
  else {
    local_2c = csp_get_ms_isr();
  }
  (local_28->field_0).field_1.last_used = local_2c;
  return local_28;
}

Assistant:

csp_packet_t * csp_can_pbuf_find(csp_can_interface_data_t * ifdata, uint32_t id, uint32_t mask, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	while (packet) {

		if ((packet->cfpid & mask) == (id & mask)) {
			packet->last_used = (task_woken) ? csp_get_ms_isr() : csp_get_ms();
			return packet;
		}
		packet = packet->next;
	}

	return NULL;

}